

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O0

void UpdateCostAtIndex(CostManager *manager,int i,int do_clean_intervals)

{
  int in_EDX;
  int in_ESI;
  CostManager *in_RDI;
  CostInterval *next;
  CostInterval *current;
  undefined7 in_stack_ffffffffffffffd8;
  bool bVar1;
  CostManager *manager_00;
  CostManager *local_18;
  
  local_18 = (CostManager *)in_RDI->head_;
  while( true ) {
    bVar1 = false;
    if (local_18 != (CostManager *)0x0) {
      bVar1 = *(int *)((long)&local_18->head_ + 4) <= in_ESI;
    }
    if (bVar1 == false) break;
    manager_00 = (CostManager *)local_18->cache_intervals_size_;
    if (in_ESI < local_18->count_) {
      UpdateCost(in_RDI,in_ESI,*(int *)&local_18->field_0xc,*(float *)&local_18->head_);
      local_18 = manager_00;
    }
    else {
      local_18 = manager_00;
      if (in_EDX != 0) {
        PopInterval(manager_00,(CostInterval *)CONCAT17(bVar1,in_stack_ffffffffffffffd8));
        local_18 = manager_00;
      }
    }
  }
  return;
}

Assistant:

static WEBP_INLINE void UpdateCostAtIndex(CostManager* const manager, int i,
                                          int do_clean_intervals) {
  CostInterval* current = manager->head_;

  while (current != NULL && current->start_ <= i) {
    CostInterval* const next = current->next_;
    if (current->end_ <= i) {
      if (do_clean_intervals) {
        // We have an outdated interval, remove it.
        PopInterval(manager, current);
      }
    } else {
      UpdateCost(manager, i, current->index_, current->cost_);
    }
    current = next;
  }
}